

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O0

JSON_Status json_serialize_to_buffer_pretty(JSON_Value *value,char *buf,size_t buf_size_in_bytes)

{
  int iVar1;
  size_t sVar2;
  ulong in_RDX;
  size_t needed_size_in_bytes;
  JSON_Value *in_stack_00000010;
  int written;
  char *in_stack_00000040;
  parson_bool_t in_stack_00000048;
  int in_stack_0000004c;
  char *in_stack_00000050;
  JSON_Value *in_stack_00000058;
  undefined4 local_4;
  
  sVar2 = json_serialization_size_pretty(in_stack_00000010);
  if ((sVar2 == 0) || (in_RDX < sVar2)) {
    local_4 = -1;
  }
  else {
    iVar1 = json_serialize_to_buffer_r
                      (in_stack_00000058,in_stack_00000050,in_stack_0000004c,in_stack_00000048,
                       in_stack_00000040);
    if (iVar1 < 0) {
      local_4 = -1;
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

JSON_Status json_serialize_to_buffer_pretty(const JSON_Value *value, char *buf, size_t buf_size_in_bytes) {
    int written = -1;
    size_t needed_size_in_bytes = json_serialization_size_pretty(value);
    if (needed_size_in_bytes == 0 || buf_size_in_bytes < needed_size_in_bytes) {
        return JSONFailure;
    }
    written = json_serialize_to_buffer_r(value, buf, 0, PARSON_TRUE, NULL);
    if (written < 0) {
        return JSONFailure;
    }
    return JSONSuccess;
}